

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall
ON_SubDDisplayParameters::Read(ON_SubDDisplayParameters *this,ON_BinaryArchive *archive)

{
  uchar uVar1;
  unsigned_short uVar2;
  Context CVar3;
  bool bVar4;
  uchar uVar5;
  undefined8 uVar6;
  uint uVar7;
  ON__UINT_PTR OVar8;
  double dVar9;
  ON_Terminator *pOVar10;
  ON_ProgressReporter *pOVar11;
  double dVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  ON_SubDComponentLocation OVar16;
  byte bVar17;
  bool bComputeCurvature;
  bool bDisplayDensityIsAbsolute;
  int chunk_version;
  uint display_density;
  uint loc_as_unsigned;
  bool local_26;
  bool local_25;
  int local_24;
  uint local_20;
  uint local_1c;
  
  dVar12 = Default.m_progress_reporter_interval.m_t[1];
  pOVar11 = Default.m_progress_reporter;
  pOVar10 = Default.m_terminator;
  dVar9 = Default.m_reserved7;
  OVar8 = Default.m_reserved6;
  uVar6 = Default._8_8_;
  uVar14 = Default._0_8_;
  (this->m_progress_reporter_interval).m_t[0] = Default.m_progress_reporter_interval.m_t[0];
  (this->m_progress_reporter_interval).m_t[1] = dVar12;
  this->m_terminator = pOVar10;
  this->m_progress_reporter = pOVar11;
  this->m_reserved6 = OVar8;
  this->m_reserved7 = dVar9;
  uVar13 = Default._0_8_;
  Default.m_bDisplayDensityIsAbsolute = SUB81(uVar14,0);
  Default.m_display_density = SUB81(uVar14,1);
  uVar1 = Default.m_display_density;
  Default.m_reserved = SUB82(uVar14,2);
  uVar2 = Default.m_reserved;
  Default.m_bControlNetMesh = SUB81(uVar14,4);
  bVar15 = Default.m_bControlNetMesh;
  Default.m_context = SUB81(uVar14,5);
  CVar3 = Default.m_context;
  Default.m_bComputeCurvature = SUB81(uVar14,6);
  bVar4 = Default.m_bComputeCurvature;
  Default.m_reserved3 = SUB81(uVar14,7);
  uVar5 = Default.m_reserved3;
  this->m_bDisplayDensityIsAbsolute = Default.m_bDisplayDensityIsAbsolute;
  Default._0_8_ = uVar13;
  uVar14 = Default._8_8_;
  this->m_display_density = uVar1;
  this->m_reserved = uVar2;
  this->m_bControlNetMesh = bVar15;
  this->m_context = CVar3;
  this->m_bComputeCurvature = bVar4;
  this->m_reserved3 = uVar5;
  Default.m_reserved4 = (uint)uVar6;
  Default.m_reserved5 = SUB84(uVar6,4);
  uVar7 = Default.m_reserved5;
  this->m_reserved4 = Default.m_reserved4;
  Default._8_8_ = uVar14;
  this->m_reserved5 = uVar7;
  local_24 = 0;
  bVar15 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&local_24);
  if (!bVar15) {
    return false;
  }
  if (0 < local_24) {
    local_20 = DisplayDensity(this,&ON_SubD::Empty);
    bVar15 = ON_BinaryArchive::ReadInt(archive,&local_20);
    if (bVar15) {
      SetAdaptiveDisplayDensity(this,local_20);
      OVar16 = MeshLocation(this);
      local_1c = (uint)OVar16;
      bVar15 = ON_BinaryArchive::ReadInt(archive,&local_1c);
      if (bVar15) {
        OVar16 = ON_SubDComponentLocationFromUnsigned(local_1c);
        SetMeshLocation(this,OVar16);
        bVar17 = 1;
        if (local_24 < 2) goto LAB_00508250;
        local_25 = false;
        bVar15 = ON_BinaryArchive::ReadBool(archive,&local_25);
        if (bVar15) {
          if (local_25 == true) {
            SetAbsoluteDisplayDensity(this,local_20);
          }
          if (local_24 < 3) goto LAB_00508250;
          local_26 = false;
          bVar15 = ON_BinaryArchive::ReadBool(archive,&local_26);
          if (bVar15) {
            SetComputeCurvature(this,local_26);
            goto LAB_00508250;
          }
        }
      }
    }
  }
  bVar17 = 0;
LAB_00508250:
  bVar15 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar15 & bVar17);
}

Assistant:

bool ON_SubDDisplayParameters::Read(class ON_BinaryArchive& archive)
{
  *this = ON_SubDDisplayParameters::Default;
  int chunk_version = 0;
  if (false == archive.BeginRead3dmAnonymousChunk(&chunk_version))
    return false;
  bool rc = false;
  for (;;)
  {
    if (chunk_version <= 0)
      break;

    unsigned int display_density = this->DisplayDensity(ON_SubD::Empty);
    if (false == archive.ReadInt(&display_density))
      break;
    SetAdaptiveDisplayDensity(display_density);

    unsigned int loc_as_unsigned = static_cast<unsigned char>(this->MeshLocation());
    if (false == archive.ReadInt(&loc_as_unsigned))
      break;
    const ON_SubDComponentLocation loc = ON_SubDComponentLocationFromUnsigned(loc_as_unsigned);
    SetMeshLocation(loc);

    if (chunk_version >= 2)
    {
      bool bDisplayDensityIsAbsolute = false;
      if (false == archive.ReadBool(&bDisplayDensityIsAbsolute))
        break;
      if (bDisplayDensityIsAbsolute)
        this->SetAbsoluteDisplayDensity(display_density);

      if (chunk_version >= 3)
      {
        bool bComputeCurvature = false;
        if (false == archive.ReadBool(&bComputeCurvature))
          break;
        this->SetComputeCurvature(bComputeCurvature);
      }
    }

    rc = true;
    break;
  }
  if (false == archive.EndRead3dmChunk())
    rc = false;
  return rc;
}